

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_trng::count128_lcg_shift_&,_const_trng::count128_lcg_shift_&> * __thiscall
Catch::ExprLhs<trng::count128_lcg_shift_const&>::operator!=
          (BinaryExpr<const_trng::count128_lcg_shift_&,_const_trng::count128_lcg_shift_&>
           *__return_storage_ptr__,ExprLhs<trng::count128_lcg_shift_const&> *this,
          count128_lcg_shift *rhs)

{
  count128_lcg_shift *pcVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = trng::operator!=(*(count128_lcg_shift **)this,rhs);
  pcVar1 = *(count128_lcg_shift **)this;
  StringRef::StringRef(&local_38,"!=");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_002e9cd0;
  __return_storage_ptr__->m_lhs = pcVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }